

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O2

void __thiscall
Refal2::CModuleBuilder::SetEntry(CModuleBuilder *this,CToken *nameToken,CToken *externalNameToken)

{
  bool bVar1;
  CPreparatoryFunction *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = checkModuleExist(this,nameToken);
  if (bVar1) {
    this_00 = addFunction(this,nameToken);
    if (this_00->type != PFT_External) {
      CPreparatoryFunction::SetEntry(this_00,externalNameToken);
      return;
    }
    std::operator+(&local_38,"function `",&nameToken->word);
    std::operator+(&bStack_58,&local_38,"` already defined as external");
    error(this,nameToken,&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void CModuleBuilder::SetEntry( const CToken& nameToken,
	const CToken& externalNameToken )
{
	if( !checkModuleExist( nameToken ) ) {
		return;
	}
	CPreparatoryFunction& function = addFunction( nameToken );
	if( function.IsExternal() ) {
		error( nameToken, "function `" + nameToken.word +
			"` already defined as external" );
	} else {
		function.SetEntry( externalNameToken );
	}
}